

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

void trie_insert(trie_node *root,trie_node *new,uint lvl)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  void *pvVar4;
  trie_node *ptVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  _Bool _Var10;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    bVar1 = root->len;
    if (new->len < bVar1) {
      uVar2 = (root->prefix).u.addr6.addr[3];
      uVar6 = *(undefined8 *)&root->prefix;
      uVar7 = *(undefined8 *)((long)&(root->prefix).u + 4);
      pvVar4 = root->data;
      uVar8 = *(undefined8 *)((long)&(new->prefix).u + 4);
      *(undefined8 *)&root->prefix = *(undefined8 *)&new->prefix;
      *(undefined8 *)((long)&(root->prefix).u + 4) = uVar8;
      (root->prefix).u.addr6.addr[3] = (new->prefix).u.addr6.addr[3];
      root->len = new->len;
      root->data = new->data;
      (new->prefix).u.addr6.addr[3] = uVar2;
      *(undefined8 *)&new->prefix = uVar6;
      *(undefined8 *)((long)&(new->prefix).u + 4) = uVar7;
      new->len = bVar1;
      new->data = pvVar4;
    }
    _Var10 = is_left_child(&new->prefix,lvl);
    if (_Var10) {
      ptVar5 = root->lchild;
      lVar9 = 0x20;
    }
    else {
      ptVar5 = root->rchild;
      lVar9 = 0x18;
    }
    if (ptVar5 == (trie_node *)0x0) break;
    lvl = lvl + 1;
    root = ptVar5;
  }
  *(trie_node **)((long)&(root->prefix).ver + lVar9) = new;
  new->parent = root;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void trie_insert(struct trie_node *root, struct trie_node *new, const unsigned int lvl)
{
	if (new->len < root->len)
		swap_nodes(root, new);

	if (is_left_child(&new->prefix, lvl)) {
		if (!root->lchild)
			return add_child_node(root, new, LEFT);

		return trie_insert(root->lchild, new, lvl + 1);
	}

	if (!root->rchild)
		return add_child_node(root, new, RIGHT);

	trie_insert(root->rchild, new, lvl + 1);
}